

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O3

void av1_fwd_txfm2d_8x16_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined1 (*pauVar1) [16];
  byte bVar2;
  code *pcVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  int iVar9;
  int iVar10;
  int8_t *piVar11;
  uint uVar12;
  ulong uVar13;
  undefined7 in_register_00000009;
  int iVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m256i in [16];
  __m256i out [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  piVar11 = av1_fwd_txfm_shift_ls[7];
  uVar13 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar3 = *(code **)((long)row_highbd_txfm8x8_arr + uVar13);
  bVar18 = tx_type < 0x10;
  uVar16 = 0x7f1f >> (tx_type & 0x1f);
  uVar12 = (uint)*av1_fwd_txfm_shift_ls[7];
  pauVar1 = (undefined1 (*) [16])(input + stride * 8);
  iVar9 = stride * 2;
  iVar14 = stride * 3;
  lVar17 = (long)(stride * 7);
  iVar15 = stride * 4;
  iVar8 = stride * 5;
  iVar10 = stride * 6;
  auVar32 = ZEXT416(uVar12);
  if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && bVar18) {
    auVar19 = *(undefined1 (*) [16])(*pauVar1 + lVar17 * 2);
    auVar23 = *(undefined1 (*) [16])(*pauVar1 + (long)iVar10 * 2);
    auVar28 = *(undefined1 (*) [16])(*pauVar1 + (long)iVar8 * 2);
    auVar29 = *(undefined1 (*) [16])(*pauVar1 + (long)iVar15 * 2);
    auVar30 = *(undefined1 (*) [16])(*pauVar1 + (long)iVar14 * 2);
    auVar26 = *(undefined1 (*) [16])(*pauVar1 + (long)iVar9 * 2);
    auVar31 = *(undefined1 (*) [16])(*pauVar1 + (long)stride * 2);
    auVar33 = *pauVar1;
    if ((uVar16 & 1) == 0 && bVar18) {
      auVar19 = vpshufb_avx(auVar19,_DAT_00567aa0);
      auVar23 = vpshufb_avx(auVar23,_DAT_00567aa0);
      auVar28 = vpshufb_avx(auVar28,_DAT_00567aa0);
      auVar29 = vpshufb_avx(auVar29,_DAT_00567aa0);
      auVar30 = vpshufb_avx(auVar30,_DAT_00567aa0);
      auVar26 = vpshufb_avx(auVar26,_DAT_00567aa0);
      auVar31 = vpshufb_avx(auVar31,_DAT_00567aa0);
      auVar33 = vpshufb_avx(auVar33,_DAT_00567aa0);
    }
    auVar24 = vpmovsxwd_avx2(auVar19);
    auVar22 = vpmovsxwd_avx2(auVar23);
    auVar25 = vpmovsxwd_avx2(auVar28);
    auVar27 = vpmovsxwd_avx2(auVar29);
    auVar21 = vpmovsxwd_avx2(auVar30);
    auVar5 = vpmovsxwd_avx2(auVar33);
    auVar6 = vpmovsxwd_avx2(auVar31);
    auVar19 = ZEXT416(uVar12);
    local_460 = vpslld_avx2(auVar24,auVar19);
    auVar24 = vpmovsxwd_avx2(auVar26);
    local_440 = vpslld_avx2(auVar22,auVar19);
    local_420 = vpslld_avx2(auVar25,auVar19);
    local_400 = vpslld_avx2(auVar27,auVar19);
    local_3e0 = vpslld_avx2(auVar21,auVar19);
    local_3c0 = vpslld_avx2(auVar24,auVar19);
    local_3a0 = vpslld_avx2(auVar6,auVar19);
    local_380 = vpslld_avx2(auVar5,auVar19);
    auVar19 = *(undefined1 (*) [16])(input + lVar17);
    auVar23 = *(undefined1 (*) [16])(input + iVar10);
    auVar28 = *(undefined1 (*) [16])(input + iVar8);
    auVar29 = *(undefined1 (*) [16])(input + iVar15);
    auVar30 = *(undefined1 (*) [16])(input + iVar14);
    auVar26 = *(undefined1 (*) [16])(input + iVar9);
    auVar31 = *(undefined1 (*) [16])(input + stride);
    auVar33 = *(undefined1 (*) [16])input;
  }
  else {
    auVar19 = *(undefined1 (*) [16])input;
    auVar23 = *(undefined1 (*) [16])(input + stride);
    auVar28 = *(undefined1 (*) [16])(input + iVar9);
    auVar29 = *(undefined1 (*) [16])(input + iVar14);
    auVar30 = *(undefined1 (*) [16])(input + iVar15);
    auVar26 = *(undefined1 (*) [16])(input + iVar8);
    auVar31 = *(undefined1 (*) [16])(input + iVar10);
    auVar33 = *(undefined1 (*) [16])(input + lVar17);
    if ((uVar16 & 1) == 0 && bVar18) {
      auVar19 = vpshufb_avx(auVar19,_DAT_00567aa0);
      auVar23 = vpshufb_avx(auVar23,_DAT_00567aa0);
      auVar28 = vpshufb_avx(auVar28,_DAT_00567aa0);
      auVar29 = vpshufb_avx(auVar29,_DAT_00567aa0);
      auVar30 = vpshufb_avx(auVar30,_DAT_00567aa0);
      auVar26 = vpshufb_avx(auVar26,_DAT_00567aa0);
      auVar31 = vpshufb_avx(auVar31,_DAT_00567aa0);
      auVar33 = vpshufb_avx(auVar33,_DAT_00567aa0);
    }
    auVar24 = vpmovsxwd_avx2(auVar19);
    auVar22 = vpmovsxwd_avx2(auVar23);
    auVar25 = vpmovsxwd_avx2(auVar28);
    auVar27 = vpmovsxwd_avx2(auVar29);
    auVar21 = vpmovsxwd_avx2(auVar30);
    auVar5 = vpmovsxwd_avx2(auVar33);
    auVar6 = vpmovsxwd_avx2(auVar31);
    local_460 = vpslld_avx2(auVar24,ZEXT416(uVar12));
    auVar24 = vpmovsxwd_avx2(auVar26);
    local_440 = vpslld_avx2(auVar22,ZEXT416(uVar12));
    auVar19 = ZEXT416(uVar12);
    local_420 = vpslld_avx2(auVar25,auVar19);
    local_400 = vpslld_avx2(auVar27,auVar19);
    local_3e0 = vpslld_avx2(auVar21,auVar19);
    local_3c0 = vpslld_avx2(auVar24,auVar19);
    local_3a0 = vpslld_avx2(auVar6,auVar32);
    local_380 = vpslld_avx2(auVar5,auVar32);
    auVar19 = *pauVar1;
    auVar23 = *(undefined1 (*) [16])(*pauVar1 + (long)stride * 2);
    auVar28 = *(undefined1 (*) [16])(*pauVar1 + (long)iVar9 * 2);
    auVar29 = *(undefined1 (*) [16])(*pauVar1 + (long)iVar14 * 2);
    auVar30 = *(undefined1 (*) [16])(*pauVar1 + (long)iVar15 * 2);
    auVar26 = *(undefined1 (*) [16])(*pauVar1 + (long)iVar8 * 2);
    auVar31 = *(undefined1 (*) [16])(*pauVar1 + (long)iVar10 * 2);
    auVar33 = *(undefined1 (*) [16])(*pauVar1 + lVar17 * 2);
  }
  if ((uVar16 & 1) == 0 && bVar18) {
    auVar19 = vpshufb_avx(auVar19,_DAT_00567aa0);
    auVar23 = vpshufb_avx(auVar23,_DAT_00567aa0);
    auVar28 = vpshufb_avx(auVar28,_DAT_00567aa0);
    auVar29 = vpshufb_avx(auVar29,_DAT_00567aa0);
    auVar30 = vpshufb_avx(auVar30,_DAT_00567aa0);
    auVar26 = vpshufb_avx(auVar26,_DAT_00567aa0);
    auVar31 = vpshufb_avx(auVar31,_DAT_00567aa0);
    auVar33 = vpshufb_avx(auVar33,_DAT_00567aa0);
  }
  auVar24 = vpmovsxwd_avx2(auVar19);
  auVar22 = vpmovsxwd_avx2(auVar23);
  auVar25 = vpmovsxwd_avx2(auVar28);
  auVar27 = vpmovsxwd_avx2(auVar29);
  auVar21 = vpmovsxwd_avx2(auVar30);
  auVar5 = vpmovsxwd_avx2(auVar33);
  auVar6 = vpmovsxwd_avx2(auVar31);
  local_360 = vpslld_avx2(auVar24,auVar32);
  auVar24 = vpmovsxwd_avx2(auVar26);
  local_340 = vpslld_avx2(auVar22,auVar32);
  local_320 = vpslld_avx2(auVar25,auVar32);
  local_300 = vpslld_avx2(auVar27,auVar32);
  local_2e0 = vpslld_avx2(auVar21,auVar32);
  local_2c0 = vpslld_avx2(auVar24,auVar32);
  local_2a0 = vpslld_avx2(auVar6,auVar32);
  local_280 = vpslld_avx2(auVar5,auVar32);
  (**(code **)((long)col_highbd_txfm8x16_arr + uVar13))(local_460,local_260,0xd,1,1);
  bVar2 = piVar11[1];
  iVar14 = 1 << (~bVar2 & 0x1f);
  auVar20._4_4_ = iVar14;
  auVar20._0_4_ = iVar14;
  auVar20._8_4_ = iVar14;
  auVar20._12_4_ = iVar14;
  auVar20._16_4_ = iVar14;
  auVar20._20_4_ = iVar14;
  auVar20._24_4_ = iVar14;
  auVar20._28_4_ = iVar14;
  auVar24 = vpaddd_avx2(auVar20,local_260);
  auVar22 = vpaddd_avx2(auVar20,local_240);
  auVar25 = vpaddd_avx2(auVar20,local_220);
  auVar27 = vpaddd_avx2(auVar20,local_200);
  auVar21 = vpaddd_avx2(auVar20,local_1e0);
  auVar5 = vpaddd_avx2(auVar20,local_1c0);
  auVar6 = vpaddd_avx2(auVar20,local_1a0);
  uVar12 = -(int)(char)bVar2;
  auVar4 = vpaddd_avx2(auVar20,local_180);
  local_260 = vpsrad_avx2(auVar24,ZEXT416(uVar12));
  local_240 = vpsrad_avx2(auVar22,ZEXT416(uVar12));
  auVar32 = ZEXT416(uVar12);
  local_220 = vpsrad_avx2(auVar25,auVar32);
  local_200 = vpsrad_avx2(auVar27,auVar32);
  local_1e0 = vpsrad_avx2(auVar21,auVar32);
  local_1c0 = vpsrad_avx2(auVar5,auVar32);
  auVar32 = ZEXT416(uVar12);
  local_1a0 = vpsrad_avx2(auVar6,auVar32);
  local_180 = vpsrad_avx2(auVar4,auVar32);
  auVar24 = vpaddd_avx2(auVar20,local_160);
  auVar22 = vpaddd_avx2(auVar20,local_140);
  auVar25 = vpaddd_avx2(auVar20,local_120);
  auVar27 = vpaddd_avx2(auVar20,local_100);
  auVar21 = vpaddd_avx2(auVar20,local_e0);
  auVar5 = vpaddd_avx2(auVar20,local_c0);
  auVar6 = vpaddd_avx2(auVar20,local_a0);
  auVar4 = vpaddd_avx2(auVar20,local_80);
  local_160 = vpsrad_avx2(auVar24,auVar32);
  local_140 = vpsrad_avx2(auVar22,auVar32);
  local_120 = vpsrad_avx2(auVar25,auVar32);
  local_100 = vpsrad_avx2(auVar27,auVar32);
  local_e0 = vpsrad_avx2(auVar21,auVar32);
  local_c0 = vpsrad_avx2(auVar5,auVar32);
  local_a0 = vpsrad_avx2(auVar6,ZEXT416(uVar12));
  local_80 = vpsrad_avx2(auVar4,ZEXT416(uVar12));
  auVar21 = vpunpckldq_avx2(local_260,local_240);
  auVar24 = vpunpckhdq_avx2(local_260,local_240);
  auVar5 = vpunpckldq_avx2(local_220,local_200);
  auVar22 = vpunpckhdq_avx2(local_220,local_200);
  auVar6 = vpunpckldq_avx2(local_1e0,local_1c0);
  auVar25 = vpunpckhdq_avx2(local_1e0,local_1c0);
  auVar4 = vpunpckldq_avx2(local_1a0,local_180);
  auVar27 = vpunpckhdq_avx2(local_1a0,local_180);
  auVar20 = vpunpcklqdq_avx2(auVar21,auVar5);
  auVar7 = vpunpcklqdq_avx2(auVar6,auVar4);
  local_460._0_16_ = ZEXT116(0) * auVar7._0_16_ + ZEXT116(1) * auVar20._0_16_;
  local_460._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar7._0_16_;
  local_360 = vperm2i128_avx2(auVar20,auVar7,0x31);
  auVar21 = vpunpckhqdq_avx2(auVar21,auVar5);
  auVar5 = vpunpckhqdq_avx2(auVar6,auVar4);
  local_420._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar21._0_16_;
  local_420._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar5._0_16_;
  local_320 = vperm2i128_avx2(auVar21,auVar5,0x31);
  auVar21 = vpunpcklqdq_avx2(auVar24,auVar22);
  auVar5 = vpunpcklqdq_avx2(auVar25,auVar27);
  local_3e0._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar21._0_16_;
  local_3e0._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar5._0_16_;
  local_2e0 = vperm2i128_avx2(auVar21,auVar5,0x31);
  auVar24 = vpunpckhqdq_avx2(auVar24,auVar22);
  auVar22 = vpunpckhqdq_avx2(auVar25,auVar27);
  local_3a0._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar24._0_16_;
  local_3a0._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar22._0_16_;
  local_2a0 = vperm2i128_avx2(auVar24,auVar22,0x31);
  auVar21 = vpunpckldq_avx2(local_160,local_140);
  auVar24 = vpunpckhdq_avx2(local_160,local_140);
  auVar5 = vpunpckldq_avx2(local_120,local_100);
  auVar22 = vpunpckhdq_avx2(local_120,local_100);
  auVar6 = vpunpckldq_avx2(local_e0,local_c0);
  auVar25 = vpunpckhdq_avx2(local_e0,local_c0);
  auVar4 = vpunpckldq_avx2(local_a0,local_80);
  auVar27 = vpunpckhdq_avx2(local_a0,local_80);
  auVar20 = vpunpcklqdq_avx2(auVar21,auVar5);
  auVar7 = vpunpcklqdq_avx2(auVar6,auVar4);
  local_440._0_16_ = ZEXT116(0) * auVar7._0_16_ + ZEXT116(1) * auVar20._0_16_;
  local_440._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * auVar7._0_16_;
  local_340 = vperm2i128_avx2(auVar20,auVar7,0x31);
  auVar21 = vpunpckhqdq_avx2(auVar21,auVar5);
  auVar5 = vpunpckhqdq_avx2(auVar6,auVar4);
  local_400._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar21._0_16_;
  local_400._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar5._0_16_;
  local_300 = vperm2i128_avx2(auVar21,auVar5,0x31);
  auVar21 = vpunpcklqdq_avx2(auVar24,auVar22);
  auVar5 = vpunpcklqdq_avx2(auVar25,auVar27);
  local_3c0._0_16_ = ZEXT116(0) * auVar5._0_16_ + ZEXT116(1) * auVar21._0_16_;
  local_3c0._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar5._0_16_;
  local_2c0 = vperm2i128_avx2(auVar21,auVar5,0x31);
  auVar24 = vpunpckhqdq_avx2(auVar24,auVar22);
  auVar22 = vpunpckhqdq_avx2(auVar25,auVar27);
  local_380._0_16_ = ZEXT116(0) * auVar22._0_16_ + ZEXT116(1) * auVar24._0_16_;
  local_380._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar22._0_16_;
  local_280 = vperm2i128_avx2(auVar24,auVar22,0x31);
  (*pcVar3)(local_460,local_260,0xd,2,2);
  bVar2 = piVar11[2];
  uVar12 = (uint)(char)bVar2;
  if ((int)uVar12 < 0) {
    iVar14 = 1 << (~bVar2 & 0x1f);
    auVar24._4_4_ = iVar14;
    auVar24._0_4_ = iVar14;
    auVar24._8_4_ = iVar14;
    auVar24._12_4_ = iVar14;
    auVar24._16_4_ = iVar14;
    auVar24._20_4_ = iVar14;
    auVar24._24_4_ = iVar14;
    auVar24._28_4_ = iVar14;
    lVar17 = 0;
    auVar22._8_4_ = 0x16a1;
    auVar22._0_8_ = 0x16a1000016a1;
    auVar22._12_4_ = 0x16a1;
    auVar22._16_4_ = 0x16a1;
    auVar22._20_4_ = 0x16a1;
    auVar22._24_4_ = 0x16a1;
    auVar22._28_4_ = 0x16a1;
    auVar25._8_4_ = 0x800;
    auVar25._0_8_ = 0x80000000800;
    auVar25._12_4_ = 0x800;
    auVar25._16_4_ = 0x800;
    auVar25._20_4_ = 0x800;
    auVar25._24_4_ = 0x800;
    auVar25._28_4_ = 0x800;
    do {
      auVar27 = vpaddd_avx2(auVar24,*(undefined1 (*) [32])(local_260 + lVar17));
      auVar27 = vpsrad_avx2(auVar27,ZEXT416(-uVar12));
      auVar27 = vpmulld_avx2(auVar27,auVar22);
      auVar27 = vpaddd_avx2(auVar27,auVar25);
      auVar27 = vpsrad_avx2(auVar27,0xc);
      *(undefined1 (*) [32])(local_460 + lVar17) = auVar27;
      lVar17 = lVar17 + 0x20;
    } while (lVar17 != 0x200);
  }
  else {
    lVar17 = 0;
    auVar27._8_4_ = 0x16a1;
    auVar27._0_8_ = 0x16a1000016a1;
    auVar27._12_4_ = 0x16a1;
    auVar27._16_4_ = 0x16a1;
    auVar27._20_4_ = 0x16a1;
    auVar27._24_4_ = 0x16a1;
    auVar27._28_4_ = 0x16a1;
    auVar21._8_4_ = 0x800;
    auVar21._0_8_ = 0x80000000800;
    auVar21._12_4_ = 0x800;
    auVar21._16_4_ = 0x800;
    auVar21._20_4_ = 0x800;
    auVar21._24_4_ = 0x800;
    auVar21._28_4_ = 0x800;
    do {
      auVar24 = vpslld_avx2(*(undefined1 (*) [32])(local_260 + lVar17),ZEXT416(uVar12));
      auVar24 = vpmulld_avx2(auVar24,auVar27);
      auVar24 = vpaddd_avx2(auVar24,auVar21);
      auVar24 = vpsrad_avx2(auVar24,0xc);
      *(undefined1 (*) [32])(local_460 + lVar17) = auVar24;
      lVar17 = lVar17 + 0x20;
    } while (lVar17 != 0x200);
  }
  memcpy(coeff,local_460,0x200);
  return;
}

Assistant:

void av1_fwd_txfm2d_8x16_avx2(const int16_t *input, int32_t *coeff, int stride,
                              TX_TYPE tx_type, int bd) {
  __m256i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const transform_1d_avx2 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_highbd_txfm8x8_arr[tx_type];
  const int8_t bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_8x16_avx2(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, out, bit, 1, 1);
  col_txfm_8x8_rounding(out, -shift[1]);
  col_txfm_8x8_rounding(&out[8], -shift[1]);
  fwd_txfm_transpose_8x8_avx2(out, in, 1, 2);
  fwd_txfm_transpose_8x8_avx2(&out[8], &in[1], 1, 2);
  row_txfm(in, out, bit, 2, 2);
  round_shift_rect_array_32_avx2(out, in, 16, -shift[2], NewSqrt2);
  store_buffer_avx2(in, coeff, 8, 16);
  (void)bd;
}